

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O0

bool __thiscall dtc::input_buffer::consume_binary<unsigned_int>(input_buffer *this,uint *out)

{
  int iVar1;
  int local_2c;
  int i;
  int type_size;
  int align;
  uint *out_local;
  input_buffer *this_local;
  
  i = 0;
  if (this->cursor % 4 != 0) {
    i = 4 - this->cursor % 4;
  }
  if (this->size < this->cursor + i + 4) {
    this_local._7_1_ = false;
  }
  else {
    this->cursor = i + this->cursor;
    if (this->cursor % 4 != 0) {
      __assert_fail("cursor % type_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/input_buffer.hh"
                    ,0xf4,"bool dtc::input_buffer::consume_binary(T &) [T = unsigned int]");
    }
    *out = 0;
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (this->size < this->cursor) {
        return false;
      }
      *out = *out << 8;
      iVar1 = this->cursor;
      this->cursor = iVar1 + 1;
      *out = (uint)(byte)this->buffer[iVar1] | *out;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool consume_binary(T &out)
	{
		int align = 0;
		int type_size = sizeof(T);
		if (cursor % type_size != 0)
		{
			align = type_size - (cursor % type_size);
		}
		if (size < cursor + align + type_size)
		{
			return false;
		}
		cursor += align;
		assert(cursor % type_size == 0);
		out = 0;
		for (int i=0 ; i<type_size ; ++i)
		{
			if (size < cursor)
			{
				return false;
			}
			out <<= 8;
			out |= (((T)buffer[cursor++]) & 0xff);
		}
		return true;
	}